

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.h
# Opt level: O2

unique_ptr<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>_>
 __thiscall
draco::SequentialNormalAttributeDecoder::CreateIntPredictionScheme
          (SequentialNormalAttributeDecoder *this,PredictionSchemeMethod method,
          PredictionSchemeTransformType transform_type)

{
  _func_int **in_RAX;
  int in_ECX;
  undefined4 in_register_00000034;
  long lVar1;
  _func_int **local_18;
  
  lVar1 = CONCAT44(in_register_00000034,method);
  local_18 = in_RAX;
  if (in_ECX == 3) {
    CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>
              ((draco *)&local_18,transform_type,*(int *)(lVar1 + 0x18),
               *(PointCloudDecoder **)(lVar1 + 8));
  }
  else {
    if (in_ECX != 2) {
      (this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
      _vptr_SequentialAttributeDecoder = (_func_int **)0x0;
      return (__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
              )(__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
                )this;
    }
    CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeNormalOctahedronDecodingTransform<int>>
              ((draco *)&local_18,transform_type,*(int *)(lVar1 + 0x18),
               *(PointCloudDecoder **)(lVar1 + 8));
  }
  (this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
  _vptr_SequentialAttributeDecoder = local_18;
  return (__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeTypedDecoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedDecoderInterface<int,_int>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeTypedDecoderInterface<int32_t>>
  CreateIntPredictionScheme(
      PredictionSchemeMethod method,
      PredictionSchemeTransformType transform_type) override {
    switch (transform_type) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      case PREDICTION_TRANSFORM_NORMAL_OCTAHEDRON: {
        typedef PredictionSchemeNormalOctahedronDecodingTransform<int32_t>
            Transform;
        // At this point the decoder has not read the quantization bits,
        // which is why we must construct the transform by default.
        // See Transform.DecodeTransformData for more details.
        return CreatePredictionSchemeForDecoder<int32_t, Transform>(
            method, attribute_id(), decoder());
      }
#endif
      case PREDICTION_TRANSFORM_NORMAL_OCTAHEDRON_CANONICALIZED: {
        typedef PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<
            int32_t>
            Transform;
        // At this point the decoder has not read the quantization bits,
        // which is why we must construct the transform by default.
        // See Transform.DecodeTransformData for more details.
        return CreatePredictionSchemeForDecoder<int32_t, Transform>(
            method, attribute_id(), decoder());
      }
      default:
        return nullptr;  // Currently, we support only octahedron transform and
                         // octahedron transform canonicalized.
    }
  }